

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QString,QVariant>::emplace_helper<QVariant_const&>
          (QHash<QString,_QVariant> *this,QString *key,QVariant *args)

{
  long lVar1;
  piter it;
  piter pVar2;
  iterator<QHashPrivate::Node<QString,_QVariant>_> *in_RDX;
  QString *in_RSI;
  Node<QString,_QVariant> *in_RDI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<QString,_QVariant>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  Data<QHashPrivate::Node<QString,_QVariant>_> *in_stack_ffffffffffffffb8;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::findOrInsert<QString>
            (in_stack_ffffffffffffffb8,&in_RDI->key);
  QHashPrivate::iterator<QHashPrivate::Node<QString,_QVariant>_>::node(in_RDX);
  QHashPrivate::Node<QString,QVariant>::createInPlace<QVariant_const&>
            (in_RDI,in_RSI,(QVariant *)in_RDX);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  QHash<QString,_QVariant>::iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }